

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposer.h
# Opt level: O3

Link __thiscall FixedDegreeProposer::random_old_link(FixedDegreeProposer *this,Network *network)

{
  pointer psVar1;
  size_t sVar2;
  result_type_conflict rVar3;
  _Rb_tree_node_base *p_Var4;
  Link LVar5;
  ulong uVar6;
  param_type local_28;
  
  local_28 = (param_type)
             ((ulong)((int)((ulong)((long)(network->node_list).
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(network->node_list).
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 2) - 1) <<
             0x20);
  LVar5.first = std::uniform_int_distribution<unsigned_int>::operator()
                          ((uniform_int_distribution<unsigned_int> *)&local_28,&this->rng->generator
                           ,&local_28);
  psVar1 = (network->links).
           super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sVar2 = *(size_t *)((long)&psVar1[LVar5.first]._M_t._M_impl.super__Rb_tree_header + 0x20);
  if (sVar2 != 0) {
    local_28 = (param_type)((ulong)((int)sVar2 - 1) << 0x20);
    rVar3 = std::uniform_int_distribution<unsigned_int>::operator()
                      ((uniform_int_distribution<unsigned_int> *)&local_28,&this->rng->generator,
                       &local_28);
    p_Var4 = *(_Base_ptr *)((long)&psVar1[LVar5.first]._M_t._M_impl.super__Rb_tree_header + 0x10);
    if (rVar3 != 0) {
      uVar6 = (ulong)rVar3;
      do {
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
    }
    LVar5.second = p_Var4[1]._M_color;
    return LVar5;
  }
  __assert_fail("list.size() != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SamplingConstrainedNetworks[P]code/source/proposer.h"
                ,0x25,"Link FixedDegreeProposer::random_old_link(const Network &) const");
}

Assistant:

Link random_old_link(Network const& network) const {
        Link link;

        link.first = rng.R(0, network.getN());

        std::set<unsigned int> const& list = network.get_links(link.first);
        assert(list.size() != 0);

        // generates a random neighberhood, link.second, of link.first
        unsigned int index_j = rng.R(0, list.size());
        std::set<unsigned int>::const_iterator it = list.begin();
        std::advance(it, index_j);
        link.second = *it;

        return link;
    }